

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int warn_is_numeric_type(lys_type *type)

{
  lys_tpdf *plVar1;
  int iVar2;
  lys_type *prev_type;
  lys_tpdf *plVar3;
  int local_2c [2];
  int found;
  
  do {
    local_2c[0] = 0;
    switch(*(LY_DATA_TYPE *)&((lys_tpdf *)type)->name) {
    case LY_TYPE_DEC64:
    case LY_TYPE_INT8:
    case LY_TYPE_UINT8:
    case LY_TYPE_INT16:
    case LY_TYPE_UINT16:
    case LY_TYPE_INT32:
    case LY_TYPE_UINT32:
    case LY_TYPE_INT64:
    case LY_TYPE_UINT64:
      goto switchD_001723d4_caseD_4;
    default:
      goto switchD_001723d4_caseD_4;
    case LY_TYPE_LEAFREF:
      if (((lys_tpdf *)type)->units == (char *)0x0) {
        plVar1 = *(lys_tpdf **)&((lys_tpdf *)type)->flags;
        plVar3 = plVar1;
        if (plVar1 + 1 != (lys_tpdf *)type) {
          __assert_fail("&((struct lys_node_leaf *)type->parent)->type == type",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                        ,0xb2f,"int warn_is_numeric_type(struct lys_type *)");
        }
        while( true ) {
          if (plVar3 == (lys_tpdf *)0x0) {
            ly_log(plVar1->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                   ,0xb32);
            return 0;
          }
          if ((plVar3->type).base == 0x800) break;
          plVar3 = (lys_tpdf *)(plVar3->type).ext;
        }
        return 0;
      }
      type = (lys_type *)((long)((lys_tpdf *)type)->units + 0x80);
      break;
    case LY_TYPE_UNION:
      prev_type = (lys_type *)0x0;
      goto LAB_00172407;
    }
  } while( true );
  while( true ) {
    local_2c[0] = 0;
    iVar2 = warn_is_numeric_type(prev_type);
    if (iVar2 != 0) break;
LAB_00172407:
    prev_type = lyp_get_next_union_type(type,prev_type,local_2c);
    if (prev_type == (lys_type *)0x0) {
switchD_001723d4_caseD_4:
      return 0;
    }
  }
switchD_001723d4_caseD_4:
  return 1;
}

Assistant:

static int
warn_is_numeric_type(struct lys_type *type)
{
    struct lys_node *node;
    struct lys_type *t = NULL;
    int found = 0, ret;

    switch (type->base) {
    case LY_TYPE_DEC64:
    case LY_TYPE_INT8:
    case LY_TYPE_UINT8:
    case LY_TYPE_INT16:
    case LY_TYPE_UINT16:
    case LY_TYPE_INT32:
    case LY_TYPE_UINT32:
    case LY_TYPE_INT64:
    case LY_TYPE_UINT64:
        return 1;
    case LY_TYPE_UNION:
        while ((t = lyp_get_next_union_type(type, t, &found))) {
            found = 0;
            ret = warn_is_numeric_type(t);
            if (ret) {
                /* found a suitable type */
                return 1;
            }
        }
        /* did not find any suitable type */
        return 0;
    case LY_TYPE_LEAFREF:
        if (!type->info.lref.target) {
            /* we may be in a grouping (and not directly in a typedef) */
            assert(&((struct lys_node_leaf *)type->parent)->type == type);
            for (node = ((struct lys_node *)type->parent); node && (node->nodetype != LYS_GROUPING); node = node->parent);
            if (!node) {
                LOGINT(((struct lys_node *)type->parent)->module->ctx);
            }
            return 0;
        }
        return warn_is_numeric_type(&type->info.lref.target->type);
    default:
        return 0;
    }
}